

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::GRULayerParams::MergePartialFromCodedStream
          (GRULayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  int length;
  uint uVar5;
  int iVar6;
  uint32 uVar7;
  WeightParams *this_00;
  Type *this_01;
  unsigned_long uVar8;
  pair<int,_int> pVar9;
  uint8 *puVar10;
  char cVar11;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  
LAB_00219a41:
  pbVar3 = input->buffer_;
  uVar7 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar12 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar5 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar7 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
      goto LAB_00219f85;
      uVar12 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar12 = uVar12 | 0x100000000;
  }
  else {
LAB_00219f85:
    uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar12 = 0;
    if (uVar7 - 1 < 0x3fff) {
      uVar12 = 0x100000000;
    }
    uVar12 = uVar7 | uVar12;
  }
  uVar7 = (uint32)uVar12;
  if ((uVar12 & 0x100000000) == 0) goto LAB_00219a9e;
  uVar5 = (uint)(uVar12 >> 3) & 0x1fffffff;
  cVar11 = (char)uVar12;
  if (uVar5 < 0x20) {
    if (uVar5 < 0xf) {
      if (uVar5 == 1) {
        if (cVar11 != '\b') goto LAB_00219a9e;
        puVar10 = input->buffer_;
        if ((puVar10 < input->buffer_end_) && (-1 < (long)(char)*puVar10)) {
          this->inputvectorsize_ = (long)(char)*puVar10;
          goto LAB_00219ec4;
        }
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->inputvectorsize_ = pVar13.first;
LAB_00219f7a:
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        goto LAB_00219a41;
      }
      if (uVar5 == 2) {
        if (cVar11 != '\x10') goto LAB_00219a9e;
        puVar10 = input->buffer_;
        if ((input->buffer_end_ <= puVar10) || ((long)(char)*puVar10 < 0)) {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->outputvectorsize_ = pVar13.first;
          goto LAB_00219f7a;
        }
        this->outputvectorsize_ = (long)(char)*puVar10;
LAB_00219ec4:
        input->buffer_ = puVar10 + 1;
        goto LAB_00219a41;
      }
      if ((uVar5 == 10) && (cVar11 == 'R')) {
        this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                            (&(this->activations_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar10 = input->buffer_;
        if ((puVar10 < input->buffer_end_) && (iVar6 = (int)(char)*puVar10, -1 < iVar6)) {
          input->buffer_ = puVar10 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar4 = ActivationParams::MergePartialFromCodedStream(this_01,input);
        goto LAB_00219e84;
      }
    }
    else if (uVar5 < 0x1e) {
      if (uVar5 == 0xf) {
        if (cVar11 != 'x') goto LAB_00219a9e;
        puVar10 = input->buffer_;
        if ((puVar10 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar10, -1 < (long)uVar8)) {
          input->buffer_ = puVar10 + 1;
        }
        else {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar13.first;
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->sequenceoutput_ = uVar8 != 0;
        goto LAB_00219a41;
      }
      if ((uVar5 == 0x14) && (cVar11 == -0x60)) {
        puVar10 = input->buffer_;
        if ((puVar10 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar10, -1 < (long)uVar8)) {
          input->buffer_ = puVar10 + 1;
        }
        else {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar13.first;
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->hasbiasvectors_ = uVar8 != 0;
        goto LAB_00219a41;
      }
    }
    else if (uVar5 == 0x1e) {
      if (cVar11 == -0xe) {
        this_00 = this->updategateweightmatrix_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->updategateweightmatrix_ = this_00;
        }
        goto LAB_00219e3b;
      }
    }
    else if ((uVar5 == 0x1f) && (cVar11 == -6)) {
      this_00 = this->resetgateweightmatrix_;
      if (this_00 == (WeightParams *)0x0) {
        this_00 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(this_00);
        this->resetgateweightmatrix_ = this_00;
      }
      goto LAB_00219e3b;
    }
  }
  else if (uVar5 < 0x46) {
    if (uVar5 < 0x33) {
      if (uVar5 == 0x20) {
        if (cVar11 == '\x02') {
          this_00 = this->outputgateweightmatrix_;
          if (this_00 == (WeightParams *)0x0) {
            this_00 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(this_00);
            this->outputgateweightmatrix_ = this_00;
          }
          goto LAB_00219e3b;
        }
      }
      else if ((uVar5 == 0x32) && (cVar11 == -0x6e)) {
        this_00 = this->updategaterecursionmatrix_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->updategaterecursionmatrix_ = this_00;
        }
        goto LAB_00219e3b;
      }
    }
    else if (uVar5 == 0x33) {
      if (cVar11 == -0x66) {
        this_00 = this->resetgaterecursionmatrix_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->resetgaterecursionmatrix_ = this_00;
        }
        goto LAB_00219e3b;
      }
    }
    else if ((uVar5 == 0x34) && (cVar11 == -0x5e)) {
      this_00 = this->outputgaterecursionmatrix_;
      if (this_00 == (WeightParams *)0x0) {
        this_00 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(this_00);
        this->outputgaterecursionmatrix_ = this_00;
      }
      goto LAB_00219e3b;
    }
  }
  else {
    if (uVar5 < 0x48) {
      if (uVar5 == 0x46) {
        if (cVar11 == '2') {
          this_00 = this->updategatebiasvector_;
          if (this_00 == (WeightParams *)0x0) {
            this_00 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(this_00);
            this->updategatebiasvector_ = this_00;
          }
          goto LAB_00219e3b;
        }
        goto LAB_00219a9e;
      }
      if ((uVar5 != 0x47) || (cVar11 != ':')) goto LAB_00219a9e;
      this_00 = this->resetgatebiasvector_;
      if (this_00 == (WeightParams *)0x0) {
        this_00 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(this_00);
        this->resetgatebiasvector_ = this_00;
      }
LAB_00219e3b:
      puVar10 = input->buffer_;
      if ((puVar10 < input->buffer_end_) && (iVar6 = (int)(char)*puVar10, -1 < iVar6)) {
        input->buffer_ = puVar10 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar4 = WeightParams::MergePartialFromCodedStream(this_00,input);
LAB_00219e84:
      if (bVar4 == false) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar9.first);
      goto LAB_00219abe;
    }
    if (uVar5 != 0x48) {
      if ((uVar5 != 100) || (cVar11 != ' ')) goto LAB_00219a9e;
      puVar10 = input->buffer_;
      if ((puVar10 < input->buffer_end_) &&
         (uVar8 = (unsigned_long)(char)*puVar10, -1 < (long)uVar8)) {
        input->buffer_ = puVar10 + 1;
      }
      else {
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar8 = pVar13.first;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->reverseinput_ = uVar8 != 0;
      goto LAB_00219a41;
    }
    if (cVar11 == 'B') {
      this_00 = this->outputgatebiasvector_;
      if (this_00 == (WeightParams *)0x0) {
        this_00 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(this_00);
        this->outputgatebiasvector_ = this_00;
      }
      goto LAB_00219e3b;
    }
  }
LAB_00219a9e:
  if (uVar7 == 0) {
    return true;
  }
  if ((uVar7 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
LAB_00219abe:
  if (bVar4 == false) {
    return false;
  }
  goto LAB_00219a41;
}

Assistant:

bool GRULayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.GRULayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 inputVectorSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 outputVectorSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activations = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activations()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool sequenceOutput = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(120u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &sequenceoutput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBiasVectors = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbiasvectors_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams updateGateWeightMatrix = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_updategateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams resetGateWeightMatrix = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_resetgateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateWeightMatrix = 32;
      case 32: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(258u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams updateGateRecursionMatrix = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_updategaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams resetGateRecursionMatrix = 51;
      case 51: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(410u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_resetgaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 52;
      case 52: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(418u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams updateGateBiasVector = 70;
      case 70: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(562u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_updategatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams resetGateBiasVector = 71;
      case 71: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(570u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_resetgatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateBiasVector = 72;
      case 72: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(578u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool reverseInput = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(800u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &reverseinput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.GRULayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.GRULayerParams)
  return false;
#undef DO_
}